

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompactCheck.h
# Opt level: O0

string * __thiscall
cppqc::CompactCheck<C_A_T_C_H_T_E_S_T_0()::$_0,void,void,bool>::classify_abi_cxx11_
          (CompactCheck<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_philipp_classen[P]CppQuickCheck_test_compact_check_tests_cpp:37:39),_void,_void,_bool>
           *this,bool *v)

{
  bool *v_00;
  long in_RSI;
  string *in_RDI;
  CompactCheckFunction<void> *in_stack_ffffffffffffffc8;
  
  v_00 = (bool *)(in_RSI + 0x32);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc8);
  CompactCheckFunction<void>::apply<std::__cxx11::string,bool>
            (in_stack_ffffffffffffffc8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,v_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return in_RDI;
}

Assistant:

std::string classify(const T&... v) const override {
    return m_classifyFnc.apply(std::string(), v...);
  }